

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  delim_c local_3b;
  delim_c local_3a;
  delim_c local_39;
  unkbyte10 local_38;
  unkbyte10 local_28;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_39.c = '(';
  pbVar2 = utility::operator>>(in,&local_39);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_3a.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3a);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_3b.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3b);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    *(unkbyte10 *)&P->kappa_ = local_28;
    *(unkbyte10 *)&P->theta_ = local_38;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t kappa, theta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> kappa >> utility::delim(' ') >> theta >>
            utility::delim(')');
        if (in)
          P = param_type(kappa, theta);
        in.flags(flags);
        return in;
      }